

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O2

com_pic_t *
com_picbuf_alloc(int width,int height,int pad_l,int pad_c,int i_scu,int f_scu,int bit_depth,
                int parallel,int *err)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  int iVar4;
  com_pic_t *p;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  s8 (*__s) [2];
  
  p = (com_pic_t *)align_malloc(0x218);
  if (p != (com_pic_t *)0x0) {
    p->bit_depth = bit_depth;
    p->width_luma = width;
    p->height_luma = height;
    p->width_chroma = width / 2;
    p->height_chroma = height / 2;
    p->padsize_luma = pad_l;
    p->padsize_chroma = pad_c;
    iVar1 = width + pad_l * 2;
    p->stride_luma = iVar1;
    iVar3 = (width / 2 + pad_c * 2) * 2;
    p->stride_chroma = iVar3;
    iVar2 = height + pad_l * 2;
    iVar4 = height / 2 + pad_c * 2;
    __n = (long)f_scu * 2;
    pvVar5 = align_malloc((int)__n + f_scu * 8 + iVar3 * iVar4 + iVar1 * iVar2 + 0xba);
    p->mem_base = pvVar5;
    if (pvVar5 != (void *)0x0) {
      uVar6 = (long)pvVar5 + 0x1fU & 0xffffffffffffffe0;
      uVar7 = (long)iVar2 * (long)p->stride_luma + uVar6 + 0x1f & 0xffffffffffffffe0;
      p->y = (pel *)((long)((p->stride_luma + 1) * pad_l) + uVar6);
      __s = (s8 (*) [2])(uVar7 + (long)iVar4 * (long)p->stride_chroma + 0x1f & 0xffffffffffffffe0);
      p->uv = (pel *)((long)((p->stride_chroma + 2) * pad_c) + uVar7);
      p->map_refi = __s;
      memset(__s,0xff,__n);
      p->map_refi = p->map_refi + (long)i_scu + 1;
      p->map_mv = (s16 (*) [2] [2])
                  (((ulong)(__s[(long)f_scu + 0xf] + 1) & 0xffffffffffffffe0) + (long)i_scu * 8 + 8)
      ;
      if (parallel == 0) {
        p->parallel_enable = 0;
LAB_00110615:
        iVar4 = 0;
        if (err == (int *)0x0) {
          return p;
        }
        goto LAB_001105fa;
      }
      p->parallel_enable = 1;
      iVar4 = pthread_mutex_init((pthread_mutex_t *)&p->mutex,(pthread_mutexattr_t *)0x0);
      if (iVar4 == 0) {
        iVar4 = pthread_cond_init((pthread_cond_t *)&p->cond,(pthread_condattr_t *)0x0);
        if (iVar4 == 0) goto LAB_00110615;
        pthread_mutex_destroy((pthread_mutex_t *)&p->mutex);
      }
      if (p->mem_base != (void *)0x0) {
        align_free(p->mem_base);
        p->mem_base = (void *)0x0;
      }
    }
    align_free(p);
  }
  p = (com_pic_t *)0x0;
  if (err == (int *)0x0) {
    return (com_pic_t *)0x0;
  }
  iVar4 = -1;
LAB_001105fa:
  *err = iVar4;
  return p;
}

Assistant:

com_pic_t * com_picbuf_alloc(int width, int height, int pad_l, int pad_c, int i_scu, int f_scu, int bit_depth, int parallel, int *err)
{
    int total_mem_size = 0;
    u8 *buf;
    com_pic_t *pic = com_malloc(sizeof(com_pic_t));

    uavs3d_assert_goto(pic != NULL, ERR);

    pic->bit_depth      = bit_depth;
    pic->width_luma     = width;
    pic->height_luma    = height;
    pic->width_chroma   = width  / 2;
    pic->height_chroma  = height / 2;
    pic->padsize_luma   = pad_l;
    pic->padsize_chroma = pad_c;
    pic->stride_luma    = width + pad_l * 2;
    pic->stride_chroma  = (width / 2 + pad_c * 2) * 2;

    /* allocate maps */
    total_mem_size = sizeof(pel) * (pic->stride_luma * (height + 2 * pad_l) + pic->stride_chroma * (height / 2 + pad_c * 2)) + // yuv buffer
                     sizeof( s8) * f_scu * REFP_NUM        + ALIGN_MASK + // map_refi
                     sizeof(s16) * f_scu * REFP_NUM * MV_D + ALIGN_MASK + // map_mv
                     ALIGN_MASK * 4;

    pic->mem_base = buf = com_malloc(total_mem_size);
    uavs3d_assert_goto(pic->mem_base, ERR);

    buf = ALIGN_POINTER(buf);

    GIVE_BUFFER (pic->y,        buf, sizeof(pel) * pic->stride_luma   * (height     + pad_l * 2));  pic->y        += pad_l * pic->stride_luma   + pad_l;
    GIVE_BUFFER (pic->uv,       buf, sizeof(pel) * pic->stride_chroma * (height / 2 + pad_c * 2));  pic->uv       += pad_c * pic->stride_chroma + pad_c * 2;
    GIVE_BUFFERV(pic->map_refi, buf, sizeof( s8) * f_scu * REFP_NUM ,   -1);                        pic->map_refi += i_scu + 1;
    GIVE_BUFFER (pic->map_mv,   buf, sizeof(s16) * f_scu * REFP_NUM * MV_D);                        pic->map_mv   += i_scu + 1;

    if (parallel) {
        pic->parallel_enable = 1;
        if (!uavs3d_pthread_mutex_init(&pic->mutex, NULL)) {
            if (uavs3d_pthread_cond_init(&pic->cond, NULL)) {
                uavs3d_pthread_mutex_destroy(&pic->mutex);
                uavs3d_assert_goto(0, ERR);
            }
        } else {
            uavs3d_assert_goto(0, ERR);
        }
    } else {
        pic->parallel_enable = 0;
    }
    if (err) {
        *err = RET_OK;
    }

    return pic;
ERR:
    if (pic) {
        com_free(pic->mem_base);   
        com_free(pic);
    }
    if (err) {
        *err = ERR_OUT_OF_MEMORY;
    }
    return NULL;
}